

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::MetafTime> * metaf::MetafTime::fromStringDDHHMM(string *s)

{
  bool bVar1;
  long lVar2;
  MetafTime *in_RDI;
  MetafTime metafTime_1;
  optional<unsigned_int> minute_1;
  optional<unsigned_int> hour_1;
  optional<unsigned_int> day;
  MetafTime metafTime;
  optional<unsigned_int> minute;
  optional<unsigned_int> hour;
  MetafTime *in_stack_ffffffffffffff98;
  MetafTime *this;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  string *in_stack_ffffffffffffffe8;
  
  this = in_RDI;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 4) {
    strToUint(in_stack_ffffffffffffffe8,
              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              in_stack_ffffffffffffffd8);
    strToUint(in_stack_ffffffffffffffe8,
              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              in_stack_ffffffffffffffd8);
    bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x240930);
    if ((bVar1) &&
       (bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x240940), bVar1))
    {
      MetafTime(this);
      std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x240980);
      std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x240990);
      std::optional<metaf::MetafTime>::optional<metaf::MetafTime,_true>
                ((optional<metaf::MetafTime> *)this,in_stack_ffffffffffffff98);
    }
    else {
      (((_Optional_base<metaf::MetafTime,_true,_true> *)&this->dayValue)->_M_payload).
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload<unsigned_int,_true,_true,_true>)0;
      this->hourValue = 0;
      this->minuteValue = 0;
      this[1].dayValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0;
    }
  }
  else {
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 6) {
      strToUint(in_stack_ffffffffffffffe8,
                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffd8);
      strToUint(in_stack_ffffffffffffffe8,
                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffd8);
      strToUint(in_stack_ffffffffffffffe8,
                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffd8);
      bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x240a10);
      if (((bVar1) &&
          (bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x240a20), bVar1
          )) && (bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x240a30),
                bVar1)) {
        MetafTime(this);
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x240a77);
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x240a87);
        std::optional<metaf::MetafTime>::optional<metaf::MetafTime,_true>
                  ((optional<metaf::MetafTime> *)this,in_stack_ffffffffffffff98);
      }
      else {
        (((_Optional_base<metaf::MetafTime,_true,_true> *)&this->dayValue)->_M_payload).
        super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
        super__Optional_base<unsigned_int,_true,_true>._M_payload =
             (_Optional_payload<unsigned_int,_true,_true,_true>)0;
        this->hourValue = 0;
        this->minuteValue = 0;
        this[1].dayValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0;
      }
    }
    else {
      (((_Optional_base<metaf::MetafTime,_true,_true> *)&this->dayValue)->_M_payload).
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload<unsigned_int,_true,_true,_true>)0;
      this->hourValue = 0;
      this->minuteValue = 0;
      this[1].dayValue.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0;
    }
  }
  return (optional<metaf::MetafTime> *)in_RDI;
}

Assistant:

std::optional<MetafTime> MetafTime::fromStringDDHHMM(const std::string & s) {
	//static const std::regex rgx ("(\\d\\d)?(\\d\\d)(\\d\\d)");
	static const std::optional<MetafTime> error;
	if (s.length() == 4) {
		const auto hour = strToUint(s, 0, 2);
		const auto minute = strToUint(s, 2, 2);
		if (!hour.has_value() || !minute.has_value()) return error;
		MetafTime metafTime;
		metafTime.hourValue = *hour;
		metafTime.minuteValue = *minute;
		return metafTime;
	}
	if (s.length() == 6) {
		const auto day = strToUint(s, 0, 2);
		const auto hour = strToUint(s, 2, 2);
		const auto minute = strToUint(s, 4, 2);
		if (!day.has_value() || !hour.has_value() || !minute.has_value()) return error;
		MetafTime metafTime;
		metafTime.dayValue = day;
		metafTime.hourValue = *hour;
		metafTime.minuteValue = *minute;
		return metafTime;
	}
	return error;
}